

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O1

int gray_conic_to(SW_FT_Vector *control,SW_FT_Vector *to,gray_PWorker worker)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  SW_FT_Vector *pSVar15;
  
  pSVar15 = worker->bez_stack;
  lVar7 = to->x * 4;
  worker->bez_stack[0].x = lVar7;
  lVar11 = to->y;
  lVar5 = lVar11 * 4;
  worker->bez_stack[0].y = lVar5;
  lVar13 = control->x;
  worker->bez_stack[1].x = lVar13 * 4;
  lVar1 = control->y;
  lVar12 = lVar1 * 4;
  worker->bez_stack[1].y = lVar12;
  lVar2 = worker->y;
  uVar8 = lVar7 + lVar13 * -8 + worker->x;
  uVar10 = -uVar8;
  if (0 < (long)uVar8) {
    uVar10 = uVar8;
  }
  uVar14 = lVar5 + lVar1 * -8 + lVar2;
  uVar8 = -uVar14;
  if (0 < (long)uVar14) {
    uVar8 = uVar14;
  }
  if (uVar8 < uVar10) {
    uVar8 = uVar10;
  }
  worker->bez_stack[2].x = worker->x;
  worker->bez_stack[2].y = lVar2;
  iVar4 = 0;
  if (uVar8 < 0x40) goto LAB_0010977e;
  lVar13 = lVar5;
  if (lVar12 < lVar5) {
    lVar13 = lVar12;
  }
  if (lVar2 < lVar13) {
    lVar13 = lVar2;
  }
  if (worker->max_ey <= lVar13 >> 8) goto LAB_0010977e;
  if (lVar12 + lVar11 * -4 != 0 && lVar5 <= lVar12) {
    lVar5 = lVar12;
  }
  if (lVar5 < lVar2) {
    lVar5 = lVar2;
  }
  if (lVar5 >> 8 < worker->min_ey) goto LAB_0010977e;
  iVar4 = 0;
  do {
    iVar4 = iVar4 + 1;
    bVar3 = 0x103 < uVar8;
    uVar8 = uVar8 >> 2;
  } while (bVar3);
  worker->lev_stack[0] = iVar4;
  uVar10 = 0;
  do {
    iVar4 = (int)uVar10;
    iVar6 = worker->lev_stack[uVar10];
    if (iVar6 < 1) {
LAB_0010977e:
      gray_render_line(worker,pSVar15->x,pSVar15->y);
      uVar9 = iVar4 - 1;
      pSVar15 = pSVar15 + -2;
    }
    else {
      pSVar15[4].x = pSVar15[2].x;
      lVar12 = pSVar15[1].y;
      lVar13 = pSVar15->x + pSVar15[1].x;
      lVar11 = pSVar15[1].x + pSVar15[2].x;
      pSVar15[3].x = lVar11 >> 1;
      pSVar15[2].x = lVar13 + lVar11 >> 2;
      pSVar15[1].x = lVar13 >> 1;
      pSVar15[4].y = pSVar15[2].y;
      lVar11 = pSVar15->y + lVar12;
      lVar12 = lVar12 + pSVar15[2].y;
      pSVar15[3].y = lVar12 >> 1;
      pSVar15[2].y = lVar11 + lVar12 >> 2;
      pSVar15[1].y = lVar11 >> 1;
      pSVar15 = pSVar15 + 2;
      uVar9 = iVar4 + 1;
      iVar6 = iVar6 + -1;
      worker->lev_stack[uVar10] = iVar6;
      worker->lev_stack[uVar10 + 1] = iVar6;
    }
    uVar10 = (ulong)uVar9;
  } while (-1 < (int)uVar9);
  return 0;
}

Assistant:

static int gray_conic_to(const SW_FT_Vector* control, const SW_FT_Vector* to,
                         gray_PWorker worker)
{
    gray_render_conic(RAS_VAR_ control, to);
    return 0;
}